

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Node<QByteArray,_QFont>::emplaceValue<QFont>
          (Node<QByteArray,_QFont> *this,QFont *args)

{
  undefined4 uVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  undefined8 local_28;
  undefined4 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QFont::QFont((QFont *)&local_28,args);
  uVar2 = *(undefined8 *)&this->value;
  *(undefined8 *)&this->value = local_28;
  uVar1 = *(undefined4 *)&this->field_0x20;
  *(undefined4 *)&this->field_0x20 = local_20;
  local_28 = uVar2;
  local_20 = uVar1;
  QFont::~QFont((QFont *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }